

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O0

void hash_EmptyMap(HashMapEntry **map)

{
  HashMapEntry *pHVar1;
  HashMapEntry *next;
  HashMapEntry *ptr;
  size_t i;
  HashMapEntry **map_local;
  
  for (ptr = (HashMapEntry *)0x0; ptr < (HashMapEntry *)0x10000;
      ptr = (HashMapEntry *)((long)&ptr->hash + 1)) {
    next = map[(long)ptr];
    while (next != (HashMapEntry *)0x0) {
      pHVar1 = next->next;
      free(next);
      next = pHVar1;
    }
    map[(long)ptr] = (HashMapEntry *)0x0;
  }
  return;
}

Assistant:

void hash_EmptyMap(HashMap map)
{
	for (size_t i = 0; i < HASHMAP_NB_BUCKETS; i++) {
		struct HashMapEntry *ptr = map[i];

		while (ptr) {
			struct HashMapEntry *next = ptr->next;

			free(ptr);
			ptr = next;
		}
		map[i] = NULL;
	}
}